

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O2

int dwarf_formexprloc(Dwarf_Attribute attr,Dwarf_Unsigned *return_exprlen,Dwarf_Ptr *block_ptr,
                     Dwarf_Error *error)

{
  ushort uVar1;
  Dwarf_Small *startaddr;
  Dwarf_Unsigned v;
  int iVar2;
  Dwarf_Byte_Ptr pDVar3;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Debug dbg_00;
  Dwarf_Debug dbg;
  Dwarf_Unsigned section_len;
  dwarfstring_u local_68;
  Dwarf_Unsigned lu_local;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Unsigned lu_leblen;
  
  dbg = (Dwarf_Debug)0x0;
  cu_context = (Dwarf_CU_Context_conflict)0x0;
  iVar2 = get_attr_dbg(&dbg,&cu_context,attr,error);
  if (iVar2 == 0) {
    uVar1 = attr->ar_attribute_form;
    if (uVar1 == 0x18) {
      section_len = 0;
      startaddr = attr->ar_debug_ptr;
      pDVar3 = _dwarf_calculate_info_section_start_ptr(cu_context,&section_len);
      lu_leblen = 0;
      lu_local = 0;
      iVar2 = dwarf_decode_leb128((char *)startaddr,&lu_leblen,&lu_local,
                                  (char *)(pDVar3 + section_len));
      v = lu_local;
      if (iVar2 == 1) {
        _dwarf_error_string(dbg,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      if (section_len < lu_local) {
        dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
        dwarfstring_append_printf_u
                  ((dwarfstring_s *)&lu_leblen,
                   "DW_DLE_ATTR_OUTSIDE_SECTION: The expression length is %u,",v);
        dwarfstring_append_printf_u
                  ((dwarfstring_s *)&lu_leblen," but the section length is just %u. Corrupt Dwarf.",
                   section_len);
      }
      else {
        local_68 = lu_leblen;
        iVar2 = _dwarf_reference_outside_section
                          (attr->ar_die,startaddr,startaddr + lu_leblen + lu_local);
        if (iVar2 == 0) {
          *return_exprlen = v;
          *block_ptr = startaddr + local_68;
          return 0;
        }
        dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
        dwarfstring_append_printf_u
                  ((dwarfstring_s *)&lu_leblen,
                   "DW_DLE_ATTR_OUTSIDE_SECTION: The expression length %u,",v);
        dwarfstring_append_printf_u
                  ((dwarfstring_s *)&lu_leblen," plus the leb value length of %u ",local_68);
        dwarfstring_append((dwarfstring_s *)&lu_leblen,
                           " runs past the end of the section. Corrupt Dwarf.");
      }
      dbg_00 = dbg;
      msg = dwarfstring_string((dwarfstring_s *)&lu_leblen);
      errval = 0x119;
    }
    else {
      section_len = (Dwarf_Unsigned)anon_var_dwarf_3b8eee;
      dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
      dwarf_get_FORM_name((uint)uVar1,(char **)&section_len);
      dwarfstring_append_printf_u
                ((dwarfstring_s *)&lu_leblen,"DW_DLE_ATTR_EXPRLOC_FORM_BAD: The form is 0x%x ",
                 (ulong)uVar1);
      dwarfstring_append_printf_s
                ((dwarfstring_s *)&lu_leblen,"(%s) but should be DW_FORM_exprloc. Corrupt Dwarf.",
                 (char *)section_len);
      dbg_00 = dbg;
      msg = dwarfstring_string((dwarfstring_s *)&lu_leblen);
      errval = 0xe0;
    }
    _dwarf_error_string(dbg_00,error,errval,msg);
    dwarfstring_destructor((dwarfstring_s *)&lu_leblen);
  }
  return 1;
}

Assistant:

int
dwarf_formexprloc(Dwarf_Attribute attr,
    Dwarf_Unsigned * return_exprlen,
    Dwarf_Ptr  * block_ptr,
    Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_CU_Context cu_context = 0;

    int res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    if (attr->ar_attribute_form == DW_FORM_exprloc ) {
        Dwarf_Die die = 0;
        Dwarf_Unsigned leb_len = 0;
        Dwarf_Byte_Ptr section_start = 0;
        Dwarf_Unsigned section_len = 0;
        Dwarf_Byte_Ptr section_end = 0;
        Dwarf_Byte_Ptr info_ptr = 0;
        Dwarf_Unsigned exprlen = 0;
        Dwarf_Small * addr = attr->ar_debug_ptr;

        info_ptr = addr;
        section_start =
            _dwarf_calculate_info_section_start_ptr(cu_context,
            &section_len);
        section_end = section_start + section_len;

        DECODE_LEB128_UWORD_LEN_CK(info_ptr, exprlen, leb_len,
            dbg,error,section_end);
        if (exprlen > section_len) {
            /* Corrupted dwarf!  */
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length is %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " but the section length is just %u. "
                "Corrupt Dwarf.",section_len);
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        die = attr->ar_die;
        /*  Is the block entirely in the section, or is
            there bug somewhere?
            Here the final addr may be 1 past end of section. */
        if (_dwarf_reference_outside_section(die,
            (Dwarf_Small *)addr,
            ((Dwarf_Small *)addr)+exprlen +leb_len)) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " plus the leb value length of "
                "%u ",leb_len);
            dwarfstring_append(&m,
                " runs past the end of the section. "
                "Corrupt Dwarf.");
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        *return_exprlen = exprlen;
        *block_ptr = addr + leb_len;
        return DW_DLV_OK;

    }
    {
        dwarfstring m;
        const char *name = "<name not known>";
        unsigned  mform = attr->ar_attribute_form;

        dwarfstring_constructor(&m);

        dwarf_get_FORM_name (mform,&name);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ATTR_EXPRLOC_FORM_BAD: "
            "The form is 0x%x ", mform);
        dwarfstring_append_printf_s(&m,
            "(%s) but should be DW_FORM_exprloc. "
            "Corrupt Dwarf.",(char *)name);
        _dwarf_error_string(dbg, error, DW_DLE_ATTR_EXPRLOC_FORM_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
    }
    return DW_DLV_ERROR;
}